

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::RemoveColumn
          (DuckTableEntry *this,ClientContext *context,RemoveColumnInfo *info)

{
  size_type *this_00;
  idx_t *this_01;
  Catalog *pCVar1;
  SchemaCatalogEntry *pSVar2;
  bool bVar3;
  bool bVar4;
  LogicalIndex index;
  pointer pCVar5;
  _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *__ht;
  ColumnDefinition *pCVar6;
  LogicalIndex LVar7;
  size_type sVar8;
  Binder *pBVar9;
  type create_info;
  type pBVar10;
  type args_2;
  CatalogException *pCVar11;
  RemoveColumnInfo *in_RCX;
  ColumnListIterator CVar12;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_1f8;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_1f0;
  undefined1 local_1e8 [8];
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  vector<duckdb::LogicalIndex,_true> adjusted_indices;
  undefined8 local_1c0;
  shared_ptr<duckdb::DataTable,_true> new_storage;
  shared_ptr<duckdb::Binder,_true> binder;
  __node_base local_180;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  bound_constraints;
  undefined8 local_160;
  LogicalIndex removed_index;
  logical_index_set_t removed_columns;
  ColumnDefinition local_108;
  
  local_1f0._M_head_impl = (CatalogEntry *)this;
  index = TableCatalogEntry::GetColumnIndex
                    ((TableCatalogEntry *)context,&in_RCX->removed_column,in_RCX->if_column_exists);
  removed_index = index;
  if (index.index == 0xffffffffffffffff) {
    if (in_RCX->if_column_exists == false) {
      pCVar11 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&removed_columns,"Cannot drop column: rowid column cannot be dropped",
                 (allocator *)&adjusted_indices);
      CatalogException::CatalogException(pCVar11,(string *)&removed_columns);
      __cxa_throw(pCVar11,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (local_1f0._M_head_impl)->_vptr_CatalogEntry = 0;
  }
  else {
    make_uniq<duckdb::CreateTableInfo,duckdb::SchemaCatalogEntry&,std::__cxx11::string&>
              ((duckdb *)&local_1f8,
               *(SchemaCatalogEntry **)&(context->config).query_verification_enabled,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &context->interrupted);
    bVar3 = *(bool *)((long)&(context->config).home_directory._M_string_length + 1);
    pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_1f8);
    (pCVar5->super_CreateInfo).temporary = bVar3;
    pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_1f8);
    Value::operator=(&(pCVar5->super_CreateInfo).comment,
                     (Value *)((long)&(context->config).home_directory.field_2 + 8));
    pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_1f8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&(pCVar5->super_CreateInfo).tags,
                (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&(context->config).profiler_settings._M_h._M_before_begin);
    removed_columns._M_h._M_buckets = &removed_columns._M_h._M_single_bucket;
    removed_columns._M_h._M_bucket_count = 1;
    removed_columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    removed_columns._M_h._M_element_count = 0;
    removed_columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    removed_columns._M_h._M_rehash_policy._M_next_resize = 0;
    removed_columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
    this_00 = &(context->config).user_variables._M_h._M_element_count;
    bVar3 = ColumnDependencyManager::HasDependents((ColumnDependencyManager *)this_00,index);
    if (bVar3) {
      __ht = &ColumnDependencyManager::GetDependents((ColumnDependencyManager *)this_00,index)->_M_h
      ;
      ::std::
      _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::operator=(&removed_columns._M_h,__ht);
    }
    if ((removed_columns._M_h._M_element_count != 0) && (in_RCX->cascade == false)) {
      pCVar11 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&adjusted_indices,
                 "Cannot drop column: column is a dependency of 1 or more generated column(s)",
                 (allocator *)&bound_constraints);
      CatalogException::CatalogException(pCVar11,(string *)&adjusted_indices);
      __cxa_throw(pCVar11,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01 = &(context->config).asof_loop_join_threshold;
    CVar12 = ColumnList::Logical((ColumnList *)this_01);
    binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CVar12.list;
    binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._0_1_ = CVar12.physical;
    ColumnList::ColumnListIterator::begin
              ((ColumnLogicalIteratorInternal *)&adjusted_indices,(ColumnListIterator *)&binder);
    ColumnList::ColumnListIterator::end
              ((ColumnLogicalIteratorInternal *)&bound_constraints,(ColumnListIterator *)&binder);
    bVar3 = false;
    while (((adjusted_indices.
             super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
             super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage !=
             (pointer)bound_constraints.
                      super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage || (local_1c0 != local_160)
            ) || (adjusted_indices.
                  super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                  super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)bound_constraints.
                           super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start))) {
      pCVar6 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                         ((ColumnLogicalIteratorInternal *)&adjusted_indices);
      LVar7 = ColumnDefinition::Logical(pCVar6);
      if (LVar7.index == index.index) {
LAB_015ef2dc:
        bVar4 = ColumnDefinition::Generated(pCVar6);
        bVar3 = (bool)(bVar3 | bVar4);
      }
      else {
        new_storage.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)ColumnDefinition::Logical(pCVar6);
        sVar8 = ::std::
                _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::count(&removed_columns._M_h,(key_type *)&new_storage);
        if (sVar8 != 0) goto LAB_015ef2dc;
        pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                               *)&local_1f8);
        ColumnDefinition::Copy(&local_108,pCVar6);
        ColumnList::AddColumn(&pCVar5->columns,&local_108);
        ColumnDefinition::~ColumnDefinition(&local_108);
      }
      adjusted_indices.super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
      super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(adjusted_indices.
                             super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                             .
                             super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->index + 1);
    }
    pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_1f8);
    if ((pCVar5->columns).columns.
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pCVar5->columns).columns.
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pCVar11 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&adjusted_indices,
                 "Cannot drop column: table only has one column remaining!",
                 (allocator *)&bound_constraints);
      CatalogException::CatalogException(pCVar11,(string *)&adjusted_indices);
      __cxa_throw(pCVar11,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ColumnDependencyManager::RemoveColumn
              (&adjusted_indices,(ColumnDependencyManager *)this_00,index,
               (long)((context->config).streaming_buffer_size -
                     (context->config).asof_loop_join_threshold) / 0xd8);
    Binder::CreateBinder
              ((Binder *)&binder,(ClientContext *)info,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
    pBVar9 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
    Binder::BindConstraints
              (&bound_constraints,pBVar9,
               (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                *)&(context->config).set_variables._M_h._M_rehash_policy._M_next_resize,
               (string *)&context->interrupted,(ColumnList *)this_01);
    create_info = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                  ::operator*((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                               *)&local_1f8);
    UpdateConstraintsOnColumnDrop
              ((DuckTableEntry *)context,&removed_index,&adjusted_indices,in_RCX,create_info,
               &bound_constraints,bVar3);
    pBVar9 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
    local_1e8 = (undefined1  [8])local_1f8._M_head_impl;
    local_1f8._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)&bound_create_info,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               pBVar9,(SchemaCatalogEntry *)local_1e8);
    if (local_1e8 != (undefined1  [8])0x0) {
      (*(((CreateInfo *)local_1e8)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_1e8 = (undefined1  [8])0x0;
    pCVar6 = ColumnList::GetColumn((ColumnList *)this_01,index);
    bVar3 = ColumnDefinition::Generated(pCVar6);
    if (bVar3) {
      pCVar1 = (Catalog *)(context->config).max_expression_depth;
      pSVar2 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
      pBVar10 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator*(&bound_create_info);
      make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::BoundCreateTableInfo&,duckdb::shared_ptr<duckdb::DataTable,true>&>
                ((duckdb *)&new_storage,pCVar1,pSVar2,pBVar10,
                 (shared_ptr<duckdb::DataTable,_true> *)
                 &(context->config).user_variables._M_h._M_bucket_count);
      (local_1f0._M_head_impl)->_vptr_CatalogEntry =
           (_func_int **)
           new_storage.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    }
    else {
      args_2 = shared_ptr<duckdb::DataTable,_true>::operator*
                         ((shared_ptr<duckdb::DataTable,_true> *)
                          &(context->config).user_variables._M_h._M_bucket_count);
      local_180._M_nxt =
           (_Hash_node_base *)ColumnList::LogicalToPhysical((ColumnList *)this_01,index);
      make_shared_ptr<duckdb::DataTable,duckdb::ClientContext&,duckdb::DataTable&,unsigned_long>
                ((ClientContext *)&new_storage,(DataTable *)info,(unsigned_long *)args_2);
      pCVar1 = (Catalog *)(context->config).max_expression_depth;
      pSVar2 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
      pBVar10 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator*(&bound_create_info);
      make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::BoundCreateTableInfo&,duckdb::shared_ptr<duckdb::DataTable,true>&>
                ((duckdb *)&local_180,pCVar1,pSVar2,pBVar10,&new_storage);
      (local_1f0._M_head_impl)->_vptr_CatalogEntry = (_func_int **)local_180._M_nxt;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_storage.internal.
                  super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    ::std::
    unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
    ~unique_ptr(&bound_create_info.
                 super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               );
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector(&bound_constraints.
               super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
             );
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::_Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::~_Vector_base
              ((_Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_> *)
               &adjusted_indices);
    ::std::
    _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&removed_columns._M_h);
    if (local_1f8._M_head_impl != (CreateTableInfo *)0x0) {
      (*((local_1f8._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>)
         local_1f0._M_head_impl;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::RemoveColumn(ClientContext &context, RemoveColumnInfo &info) {
	auto removed_index = GetColumnIndex(info.removed_column, info.if_column_exists);
	if (!removed_index.IsValid()) {
		if (!info.if_column_exists) {
			throw CatalogException("Cannot drop column: rowid column cannot be dropped");
		}
		return nullptr;
	}

	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;

	logical_index_set_t removed_columns;
	if (column_dependency_manager.HasDependents(removed_index)) {
		removed_columns = column_dependency_manager.GetDependents(removed_index);
	}
	if (!removed_columns.empty() && !info.cascade) {
		throw CatalogException("Cannot drop column: column is a dependency of 1 or more generated column(s)");
	}
	bool dropped_column_is_generated = false;
	for (auto &col : columns.Logical()) {
		if (col.Logical() == removed_index || removed_columns.count(col.Logical())) {
			if (col.Generated()) {
				dropped_column_is_generated = true;
			}
			continue;
		}
		create_info->columns.AddColumn(col.Copy());
	}
	if (create_info->columns.empty()) {
		throw CatalogException("Cannot drop column: table only has one column remaining!");
	}
	auto adjusted_indices = column_dependency_manager.RemoveColumn(removed_index, columns.LogicalColumnCount());

	auto binder = Binder::CreateBinder(context);
	auto bound_constraints = binder->BindConstraints(constraints, name, columns);

	UpdateConstraintsOnColumnDrop(removed_index, adjusted_indices, info, *create_info, bound_constraints,
	                              dropped_column_is_generated);

	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	if (columns.GetColumn(LogicalIndex(removed_index)).Generated()) {
		return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
	}
	auto new_storage =
	    make_shared_ptr<DataTable>(context, *storage, columns.LogicalToPhysical(LogicalIndex(removed_index)).index);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, new_storage);
}